

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::Not(VirtualMachine *this)

{
  bool bVar1;
  Variable VVar2;
  Variable var;
  Variable top;
  VirtualMachine *this_local;
  
  VVar2 = popOpStack(this);
  var.field_1 = VVar2.field_1;
  var._4_4_ = 0;
  var.type = VVar2.type;
  bVar1 = booleanValueOfVariable(this,var);
  pushBoolean(this,(bool)((bVar1 ^ 0xffU) & 1));
  advance(this);
  return;
}

Assistant:

void runtime::VirtualMachine::Not() {
  Variable top = this->popOpStack();
  this->pushBoolean(!this->booleanValueOfVariable(top));
  this->advance();
}